

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleStringCollection::allocate(SimpleStringCollection *this,size_t _size)

{
  size_t sVar1;
  size_t *psVar2;
  SimpleString *pSVar3;
  long lVar4;
  
  pSVar3 = this->collection_;
  if (pSVar3 != (SimpleString *)0x0) {
    sVar1 = pSVar3[-1].bufferSize_;
    if (sVar1 != 0) {
      lVar4 = sVar1 << 4;
      do {
        SimpleString::~SimpleString((SimpleString *)((long)&pSVar3[-1].buffer_ + lVar4));
        lVar4 = lVar4 + -0x10;
      } while (lVar4 != 0);
    }
    operator_delete__(&pSVar3[-1].bufferSize_,sVar1 << 4 | 8);
  }
  this->size_ = _size;
  psVar2 = (size_t *)
           operator_new__(-(ulong)(_size >> 0x3c != 0) | _size * 0x10 | 8,
                          "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O2/_deps/cpputest-src/src/CppUTest/SimpleString.cpp"
                          ,0x421);
  *psVar2 = _size;
  if (_size != 0) {
    lVar4 = 0;
    pSVar3 = (SimpleString *)(psVar2 + 1);
    do {
      SimpleString::SimpleString(pSVar3,"");
      lVar4 = lVar4 + -0x10;
      pSVar3 = pSVar3 + 1;
    } while (-lVar4 != _size * 0x10);
  }
  this->collection_ = (SimpleString *)(psVar2 + 1);
  return;
}

Assistant:

void SimpleStringCollection::allocate(size_t _size)
{
    delete[] collection_;

    size_ = _size;
    collection_ = new SimpleString[size_];
}